

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
::update(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
         *this,char_range key)

{
  uint32_t uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  value_type *pvVar5;
  undefined8 *puVar6;
  byte bVar7;
  char *pcVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint64_t pos;
  pair<const_int_*,_unsigned_long> pVar11;
  uint64_t node_id;
  char_range local_200;
  undefined1 local_1f0 [24];
  pointer puStack_1d8;
  pointer local_1d0;
  uint64_t local_1c8;
  uint64_t uStack_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t uStack_1a8;
  size_p2 sStack_1a0;
  size_p2 sStack_190;
  compact_bonsai_nlm<int,_64UL> local_180;
  undefined1 auStack_140 [272];
  
  local_200.end = key.end;
  local_200.begin = key.begin;
  if (local_200.begin == local_200.end) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar6 = &PTR__exception_00183a50;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_200.end[-1] == 0) {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
               *)local_1f0,0,0x20);
          *(undefined8 *)this = local_1f0._0_8_;
          this->lambda_ = local_1f0._8_8_;
          puVar2 = (this->hash_trie_).table_.chunks_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (this->hash_trie_).table_.chunks_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (this->hash_trie_).table_.chunks_.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1f0._16_8_;
          (this->hash_trie_).table_.chunks_.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puStack_1d8;
          register0x00001200 = ZEXT816(0) << 0x20;
          (this->hash_trie_).table_.chunks_.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_1d0;
          local_1d0 = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)puVar3 - (long)puVar2);
          }
          (this->hash_trie_).table_.width_ = local_1b8;
          (this->hash_trie_).table_.size_ = local_1c8;
          (this->hash_trie_).table_.mask_ = uStack_1c0;
          (this->hash_trie_).capa_size_.bits_ = sStack_1a0.bits_;
          *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = sStack_1a0._4_4_;
          (this->hash_trie_).capa_size_.mask_ = sStack_1a0.mask_;
          (this->hash_trie_).symb_size_.bits_ = sStack_190.bits_;
          *(undefined4 *)&(this->hash_trie_).symb_size_.field_0x4 = sStack_190._4_4_;
          (this->hash_trie_).symb_size_.mask_ = sStack_190.mask_;
          (this->hash_trie_).size_ = local_1b0;
          (this->hash_trie_).max_size_ = uStack_1a8;
          (this->hash_trie_).capa_size_.bits_ = sStack_1a0.bits_;
          *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = sStack_1a0._4_4_;
          (this->hash_trie_).capa_size_.mask_ = sStack_1a0.mask_;
          compact_bonsai_nlm<int,_64UL>::operator=(&this->label_store_,&local_180);
          memcpy(&this->codes_,auStack_140,0x110);
          ~map((map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
                *)local_1f0);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        pos = 1;
LAB_0015cdb4:
        pvVar5 = compact_bonsai_nlm<int,_64UL>::insert(&this->label_store_,pos,&local_200);
      }
      else {
        local_1f0._0_8_ = 1;
        do {
          pVar11 = compact_bonsai_nlm<int,_64UL>::compare
                             (&this->label_store_,local_1f0._0_8_,&local_200);
          uVar10 = pVar11.second;
          if (pVar11.first != (value_type *)0x0) {
            return pVar11.first;
          }
          local_200.begin = local_200.begin + uVar10;
          if (this->lambda_ <= uVar10) {
            do {
              bVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                                (&this->hash_trie_,(uint64_t *)local_1f0,0xff);
              if (bVar4) {
                expand_if_needed_(this,(uint64_t *)local_1f0);
              }
              uVar10 = uVar10 - this->lambda_;
            } while (this->lambda_ <= uVar10);
          }
          bVar7 = (this->codes_)._M_elems[*local_200.begin];
          if (bVar7 == 0xff) {
            uVar1 = this->num_codes_;
            uVar9 = uVar1 + 1;
            this->num_codes_ = uVar9;
            (this->codes_)._M_elems[*local_200.begin] = (uchar)uVar1;
            if (uVar9 == 0xff) {
              puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar6 = &PTR__exception_00183a50;
              pcVar8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
              ;
              goto LAB_0015ce20;
            }
            bVar7 = (this->codes_)._M_elems[*local_200.begin];
          }
          bVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                            (&this->hash_trie_,(uint64_t *)local_1f0,uVar10 << 8 | (ulong)bVar7);
          if (bVar4) {
            expand_if_needed_(this,(uint64_t *)local_1f0);
            local_200.begin = local_200.begin + 1;
            this->size_ = this->size_ + 1;
            pos = local_1f0._0_8_;
            goto LAB_0015cdb4;
          }
          local_200.begin = local_200.begin + 1;
        } while (local_200.begin != local_200.end);
        pVar11 = compact_bonsai_nlm<int,_64UL>::compare
                           (&this->label_store_,local_1f0._0_8_,&local_200);
        pvVar5 = pVar11.first;
      }
      return pvVar5;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar6 = &PTR__exception_00183a50;
    pcVar8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_0015ce20:
  puVar6[1] = pcVar8;
  __cxa_throw(puVar6,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }